

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool crnd::crnd_validate_file(void *pData,uint32 data_size,crn_file_info *pFile_info)

{
  uint16 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  uint uVar6;
  crn_header *pcVar7;
  uint local_40;
  uint local_3c;
  uint32 next_ofs;
  uint32 i;
  uint32 data_crc;
  uint32 header_crc;
  crn_header *pHeader;
  crn_file_info *pFile_info_local;
  uint32 data_size_local;
  void *pData_local;
  
  if (pFile_info != (crn_file_info *)0x0) {
    if (*(int *)pFile_info != 0x68) {
      return false;
    }
    memset(pFile_info + 4,0,100);
  }
  if (((pData != (void *)0x0) && (0x3d < data_size)) &&
     (pcVar7 = crnd_get_header(pData,data_size), pcVar7 != (crn_header *)0x0)) {
    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                      ((crn_packed_uint *)&pcVar7->m_header_size);
    uVar1 = crc16(&pcVar7->m_data_size,uVar2 - 6,0);
    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                      ((crn_packed_uint *)&pcVar7->m_header_crc16);
    if (uVar1 == uVar2) {
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar7->m_header_size);
      uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar7->m_data_size);
      uVar4 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar7->m_header_size);
      uVar1 = crc16((void *)((long)pData + (ulong)uVar2),uVar3 - uVar4,0);
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar7->m_data_crc16);
      if (uVar1 == uVar2) {
        uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar7->m_faces);
        if ((uVar2 != 1) &&
           (uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                              ((crn_packed_uint *)&pcVar7->m_faces), uVar2 != 6)) {
          return false;
        }
        uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar7->m_width);
        if ((uVar2 != 0) &&
           (uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                              ((crn_packed_uint *)&pcVar7->m_width), uVar2 < 0x1001)) {
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)&pcVar7->m_height);
          if ((uVar2 != 0) &&
             (uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                ((crn_packed_uint *)&pcVar7->m_height), uVar2 < 0x1001)) {
            uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                              ((crn_packed_uint *)&pcVar7->m_levels);
            if (uVar2 != 0) {
              uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                ((crn_packed_uint *)&pcVar7->m_levels);
              uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                                ((crn_packed_uint *)&pcVar7->m_width);
              uVar4 = crn_packed_uint::operator_cast_to_unsigned_int
                                ((crn_packed_uint *)&pcVar7->m_height);
              uVar5 = utils::compute_max_mips(uVar3,uVar4);
              if (uVar2 <= uVar5) {
                uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                  ((crn_packed_uint *)&pcVar7->m_format);
                if ((-1 < (int)uVar2) &&
                   (uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&pcVar7->m_format), (int)uVar2 < 0xf)) {
                  if (pFile_info != (crn_file_info *)0x0) {
                    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&pcVar7->m_data_size);
                    *(uint *)(pFile_info + 4) = uVar2;
                    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&pcVar7->m_header_size);
                    *(uint *)(pFile_info + 8) = uVar2;
                    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&(pcVar7->m_color_endpoints).m_size);
                    uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&(pcVar7->m_color_selectors).m_size);
                    uVar4 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&(pcVar7->m_alpha_endpoints).m_size);
                    uVar6 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&(pcVar7->m_alpha_selectors).m_size);
                    *(uint *)(pFile_info + 0xc) = uVar2 + uVar3 + uVar4 + uVar6;
                    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&pcVar7->m_tables_size);
                    *(uint *)(pFile_info + 0x10) = uVar2;
                    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&pcVar7->m_levels);
                    *(uint *)(pFile_info + 0x14) = uVar2;
                    for (local_3c = 0;
                        uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                          ((crn_packed_uint *)&pcVar7->m_levels), local_3c < uVar2;
                        local_3c = local_3c + 1) {
                      local_40 = crn_packed_uint::operator_cast_to_unsigned_int
                                           ((crn_packed_uint *)&pcVar7->m_data_size);
                      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                        ((crn_packed_uint *)&pcVar7->m_levels);
                      if (local_3c + 1 < uVar2) {
                        local_40 = crn_packed_uint::operator_cast_to_unsigned_int
                                             ((crn_packed_uint *)
                                              (pcVar7->m_level_ofs + (local_3c + 1)));
                      }
                      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                        ((crn_packed_uint *)(pcVar7->m_level_ofs + local_3c));
                      *(uint *)(pFile_info + (ulong)local_3c * 4 + 0x18) = local_40 - uVar2;
                    }
                    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&(pcVar7->m_color_endpoints).m_num);
                    *(uint *)(pFile_info + 0x58) = uVar2;
                    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&(pcVar7->m_color_selectors).m_num);
                    *(uint *)(pFile_info + 0x5c) = uVar2;
                    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&(pcVar7->m_alpha_endpoints).m_num);
                    *(uint *)(pFile_info + 0x60) = uVar2;
                    uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                      ((crn_packed_uint *)&(pcVar7->m_alpha_selectors).m_num);
                    *(uint *)(pFile_info + 100) = uVar2;
                  }
                  return true;
                }
                return false;
              }
            }
            return false;
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool crnd_validate_file(const void* pData, uint32 data_size, crn_file_info* pFile_info)
    {
        if (pFile_info)
        {
            if (pFile_info->m_struct_size != sizeof(crn_file_info))
                return false;

            memset(&pFile_info->m_struct_size + 1, 0, sizeof(crn_file_info) - sizeof(pFile_info->m_struct_size));
        }

        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return false;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return false;

        const uint32 header_crc = crc16(&pHeader->m_data_size, (uint32)(pHeader->m_header_size - ((const uint8*)&pHeader->m_data_size - (const uint8*)pHeader)));
        if (header_crc != pHeader->m_header_crc16)
            return false;

        const uint32 data_crc = crc16((const uint8*)pData + pHeader->m_header_size, pHeader->m_data_size - pHeader->m_header_size);
        if (data_crc != pHeader->m_data_crc16)
            return false;

        if ((pHeader->m_faces != 1) && (pHeader->m_faces != 6))
            return false;
        if ((pHeader->m_width < 1) || (pHeader->m_width > cCRNMaxLevelResolution))
            return false;
        if ((pHeader->m_height < 1) || (pHeader->m_height > cCRNMaxLevelResolution))
            return false;
        if ((pHeader->m_levels < 1) || (pHeader->m_levels > utils::compute_max_mips(pHeader->m_width, pHeader->m_height)))
            return false;
        if (((int)pHeader->m_format < cCRNFmtDXT1) || ((int)pHeader->m_format >= cCRNFmtTotal))
            return false;

        if (pFile_info)
        {
            pFile_info->m_actual_data_size = pHeader->m_data_size;
            pFile_info->m_header_size = pHeader->m_header_size;
            pFile_info->m_total_palette_size = pHeader->m_color_endpoints.m_size + pHeader->m_color_selectors.m_size + pHeader->m_alpha_endpoints.m_size + pHeader->m_alpha_selectors.m_size;
            pFile_info->m_tables_size = pHeader->m_tables_size;

            pFile_info->m_levels = pHeader->m_levels;

            for (uint32 i = 0; i < pHeader->m_levels; i++)
            {
                uint32 next_ofs = pHeader->m_data_size;

                // assumes the levels are packed together sequentially
                if ((i + 1) < pHeader->m_levels)
                    next_ofs = pHeader->m_level_ofs[i + 1];

                pFile_info->m_level_compressed_size[i] = next_ofs - pHeader->m_level_ofs[i];
            }

            pFile_info->m_color_endpoint_palette_entries = pHeader->m_color_endpoints.m_num;
            pFile_info->m_color_selector_palette_entries = pHeader->m_color_selectors.m_num;;
            pFile_info->m_alpha_endpoint_palette_entries = pHeader->m_alpha_endpoints.m_num;;
            pFile_info->m_alpha_selector_palette_entries = pHeader->m_alpha_selectors.m_num;;
        }

        return true;
    }